

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::changeColsIntegrality
          (Highs *this,HighsInt num_set_entries,HighsInt *set,HighsVarType *integrality)

{
  HighsInt create_error;
  HighsStatus HVar1;
  allocator local_1a9;
  vector<int,_std::allocator<int>_> local_set;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_integrality;
  string local_178;
  string local_158;
  HighsIndexCollection index_collection;
  HighsLogOptions local_e8;
  HighsLogOptions local_88;
  
  if (num_set_entries == 0) {
    return kOk;
  }
  clearPresolve(this);
  std::vector<HighsVarType,std::allocator<HighsVarType>>::vector<HighsVarType_const*,void>
            ((vector<HighsVarType,std::allocator<HighsVarType>> *)&local_integrality,integrality,
             integrality + num_set_entries,(allocator_type *)&index_collection);
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&local_set,set,set + num_set_entries,
             (allocator_type *)&index_collection);
  sortSetData(num_set_entries,&local_set,integrality,
              local_integrality.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
              _M_impl.super__Vector_impl_data._M_start);
  index_collection.dimension_ = -1;
  index_collection.is_interval_ = false;
  index_collection.from_ = -1;
  index_collection.to_ = -2;
  index_collection.is_set_ = false;
  index_collection.set_num_entries_ = -1;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  index_collection._41_8_ = 0;
  create_error = create(&index_collection,num_set_entries,
                        local_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,(this->model_).lp_.num_col_);
  if (create_error == 0) {
    HVar1 = changeIntegralityInterface
                      (this,&index_collection,
                       local_integrality.
                       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                       super__Vector_impl_data._M_start);
    HighsLogOptions::HighsLogOptions
              (&local_e8,&(this->options_).super_HighsOptionsStruct.log_options);
    std::__cxx11::string::string((string *)&local_178,"changeIntegrality",&local_1a9);
    HVar1 = interpretCallStatus(&local_e8,HVar1,kOk,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::_Function_base::~_Function_base(&local_e8.user_callback.super__Function_base);
    if (HVar1 != kError) {
      HVar1 = returnFromHighs(this,HVar1);
      goto LAB_00237fc0;
    }
  }
  else {
    HighsLogOptions::HighsLogOptions
              (&local_88,&(this->options_).super_HighsOptionsStruct.log_options);
    std::__cxx11::string::string
              ((string *)&local_158,"changeColsIntegrality",(allocator *)&local_178);
    analyseSetCreateError
              (&local_88,&local_158,create_error,true,num_set_entries,
               local_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,(this->model_).lp_.num_col_);
    std::__cxx11::string::~string((string *)&local_158);
    std::_Function_base::~_Function_base(&local_88.user_callback.super__Function_base);
  }
  HVar1 = kError;
LAB_00237fc0:
  HighsIndexCollection::~HighsIndexCollection(&index_collection);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_set.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<HighsVarType,_std::allocator<HighsVarType>_>::~_Vector_base
            (&local_integrality.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>);
  return HVar1;
}

Assistant:

HighsStatus Highs::changeColsIntegrality(const HighsInt num_set_entries,
                                         const HighsInt* set,
                                         const HighsVarType* integrality) {
  if (num_set_entries == 0) return HighsStatus::kOk;
  clearPresolve();
  // Ensure that the set and data are in ascending order
  std::vector<HighsVarType> local_integrality{integrality,
                                              integrality + num_set_entries};
  std::vector<HighsInt> local_set{set, set + num_set_entries};
  sortSetData(num_set_entries, local_set, integrality,
              local_integrality.data());
  HighsIndexCollection index_collection;
  const HighsInt create_error = create(index_collection, num_set_entries,
                                       local_set.data(), model_.lp_.num_col_);
  if (create_error)
    return analyseSetCreateError(options_.log_options, "changeColsIntegrality",
                                 create_error, true, num_set_entries,
                                 local_set.data(), model_.lp_.num_col_);
  HighsStatus call_status =
      changeIntegralityInterface(index_collection, local_integrality.data());
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "changeIntegrality");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}